

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O1

void Abc_NtkHaigResetReprsOld(Hop_Man_t *pMan)

{
  Vec_Ptr_t *vMembers;
  Vec_Ptr_t *__ptr;
  
  vMembers = Abc_NtkHaigCollectMembers(pMan);
  printf("Collected %6d class members.\n",(ulong)(uint)vMembers->nSize);
  __ptr = Abc_NtkHaigCreateClasses(vMembers);
  printf("Collected %6d classes. (Ave = %5.2f)\n",
         (double)((float)vMembers->nSize / (float)__ptr->nSize));
  if (vMembers->pArray != (void **)0x0) {
    free(vMembers->pArray);
    vMembers->pArray = (void **)0x0;
  }
  if (vMembers != (Vec_Ptr_t *)0x0) {
    free(vMembers);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Abc_NtkHaigResetReprsOld( Hop_Man_t * pMan )
{
    Vec_Ptr_t * vMembers, * vClasses;

    // collect members of the classes and make them point to reprs
    vMembers = Abc_NtkHaigCollectMembers( pMan );
    printf( "Collected %6d class members.\n", Vec_PtrSize(vMembers) );

    // create classes
    vClasses = Abc_NtkHaigCreateClasses( vMembers );
    printf( "Collected %6d classes. (Ave = %5.2f)\n", Vec_PtrSize(vClasses), 
        (float)(Vec_PtrSize(vMembers))/Vec_PtrSize(vClasses) );

    Vec_PtrFree( vMembers );
    Vec_PtrFree( vClasses );
}